

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  iterator *piVar1;
  _Rb_tree_header *p_Var2;
  cmMakefile *this_00;
  cmLocalGenerator *this_01;
  _Elt_pointer ppcVar3;
  cmTarget *pcVar4;
  bool bVar5;
  cmGlobalGenerator *pcVar6;
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  *__x;
  _Base_ptr p_Var7;
  string *psVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  pointer config;
  pointer ppcVar11;
  cmCustomCommand *pcVar12;
  _Rb_tree_header *p_Var13;
  bool bVar14;
  bool bVar15;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar16;
  cmSourceFile *sf;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_> tgts;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  ostringstream e;
  cmSourceFile *local_2a0;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  deque<cmSourceFile*,std::allocator<cmSourceFile*>> *local_260;
  _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
  *local_258;
  string *local_250;
  string local_248;
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  local_228;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_1f8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->Target = target->Target;
  this->GeneratorTarget = target;
  local_260 = (deque<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceQueue;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::_M_initialize_map
            ((_Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_260,0);
  local_258 = (_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               *)&this->SourcesQueued;
  p_Var2 = &(this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->SourcesQueued)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->NameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NewSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Target->Makefile;
  this->Makefile = this_00;
  pcVar6 = cmMakefile::GetGlobalGenerator(this_00);
  this->GlobalGenerator = pcVar6;
  this->CurrentEntry = (SourceEntry *)0x0;
  if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_1c8,this->Makefile,&local_278,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1f8._M_impl.super__Rb_tree_header._M_header;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_278.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
    }
    else {
      p_Var2 = &local_228._M_impl.super__Rb_tree_header;
      config = local_278.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_250 = config;
        cmTarget::GetSourceFiles(this->Target,&local_298,config);
        bVar5 = false;
        bVar15 = local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        ppcVar11 = local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        while (!bVar15) {
          local_2a0 = *ppcVar11;
          __x = &cmGlobalGenerator::GetFilenameTargetDepends(this->GlobalGenerator,local_2a0)->_M_t;
          std::
          _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
          ::_Rb_tree(&local_228,__x);
          p_Var7 = &p_Var2->_M_header;
          if (local_228._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var10 = local_228._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              bVar14 = *(cmTarget **)(p_Var10 + 1) < this->Target;
              if (!bVar14) {
                p_Var7 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[bVar14];
            } while (p_Var10 != (_Base_ptr)0x0);
          }
          p_Var13 = p_Var2;
          if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
             (p_Var13 = (_Rb_tree_header *)p_Var7,
             this->Target < (cmTarget *)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var13 = p_Var2;
          }
          if (p_Var13 == p_Var2) {
            pVar16 = std::
                     _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                     ::_M_insert_unique<cmSourceFile*const&>
                               ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                                 *)&local_1f8,&local_2a0);
            if ((((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (pVar16 = std::
                         _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         ::_M_insert_unique<cmSourceFile*const&>(local_258,&local_2a0),
               ((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
              ppcVar3 = (this->SourceQueue).c.
                        super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppcVar3 ==
                  (this->SourceQueue).c.
                  super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_push_back_aux<cmSourceFile*const&>(local_260,&local_2a0);
              }
              else {
                *ppcVar3 = local_2a0;
                piVar1 = &(this->SourceQueue).c.
                          super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                          .super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Evaluation output file\n  \"",0x1a);
            psVar8 = cmSourceFile::GetFullPath(local_2a0,(string *)0x0);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,
                                psVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,
                       "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                       ,0x62);
            this_01 = this->GeneratorTarget->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this_01,FATAL_ERROR,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          std::
          _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
          ::~_Rb_tree(&local_228);
          if (p_Var13 != p_Var2) {
            bVar5 = true;
            break;
          }
          ppcVar11 = ppcVar11 + 1;
          bVar15 = ppcVar11 ==
                   local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_298.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar15) goto LAB_00312021;
        config = local_250 + 1;
      } while (config != local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      bVar5 = false;
LAB_00312021:
      std::
      _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
      ::~_Rb_tree(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_278);
      if (bVar5) {
        return;
      }
    }
  }
  pcVar4 = this->Target;
  for (pcVar12 = (pcVar4->PreBuildCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar12 !=
      (pcVar4->PreBuildCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish; pcVar12 = pcVar12 + 1) {
    CheckCustomCommand(this,pcVar12);
  }
  pcVar4 = this->Target;
  for (pcVar12 = (pcVar4->PreLinkCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar12 !=
      (pcVar4->PreLinkCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish; pcVar12 = pcVar12 + 1) {
    CheckCustomCommand(this,pcVar12);
  }
  pcVar4 = this->Target;
  for (pcVar12 = (pcVar4->PostBuildCommands).
                 super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar12 !=
      (pcVar4->PostBuildCommands).
      super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
      super__Vector_impl_data._M_finish; pcVar12 = pcVar12 + 1) {
    CheckCustomCommand(this,pcVar12);
  }
  return;
}

Assistant:

cmTargetTraceDependencies
::cmTargetTraceDependencies(cmGeneratorTarget* target):
  Target(target->Target), GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = this->Target->GetMakefile();
  this->GlobalGenerator = this->Makefile->GetGlobalGenerator();
  this->CurrentEntry = 0;

  // Queue all the source files already specified for the target.
  if (this->Target->GetType() != cmTarget::INTERFACE_LIBRARY)
    {
    std::vector<std::string> configs;
    this->Makefile->GetConfigurations(configs);
    if (configs.empty())
      {
      configs.push_back("");
      }
    std::set<cmSourceFile*> emitted;
    for(std::vector<std::string>::const_iterator ci = configs.begin();
        ci != configs.end(); ++ci)
      {
      std::vector<cmSourceFile*> sources;
      this->Target->GetSourceFiles(sources, *ci);
      for(std::vector<cmSourceFile*>::const_iterator si = sources.begin();
          si != sources.end(); ++si)
        {
        cmSourceFile* sf = *si;
        const std::set<cmTarget const*> tgts =
                          this->GlobalGenerator->GetFilenameTargetDepends(sf);
        if (tgts.find(this->Target) != tgts.end())
          {
          std::ostringstream e;
          e << "Evaluation output file\n  \"" << sf->GetFullPath()
            << "\"\ndepends on the sources of a target it is used in.  This "
              "is a dependency loop and is not allowed.";
          this->GeneratorTarget
              ->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
          return;
          }
        if(emitted.insert(sf).second && this->SourcesQueued.insert(sf).second)
          {
          this->SourceQueue.push(sf);
          }
        }
      }
    }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(this->Target->GetPreBuildCommands());
  this->CheckCustomCommands(this->Target->GetPreLinkCommands());
  this->CheckCustomCommands(this->Target->GetPostBuildCommands());
}